

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan.c
# Opt level: O0

GLFWvkproc glfwGetInstanceProcAddress(VkInstance_conflict instance,char *procname)

{
  GLFWbool GVar1;
  char *in_RSI;
  VkInstance_conflict in_RDI;
  GLFWvkproc proc;
  PFN_vkVoidFunction local_20;
  PFN_vkVoidFunction local_8;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    local_8 = (PFN_vkVoidFunction)0x0;
  }
  else {
    GVar1 = _glfwInitVulkan((int)in_RDI);
    if (GVar1 == 0) {
      local_8 = (PFN_vkVoidFunction)0x0;
    }
    else {
      local_20 = (*_glfw.vk.GetInstanceProcAddr)(in_RDI,in_RSI);
      if (local_20 == (PFN_vkVoidFunction)0x0) {
        local_20 = (PFN_vkVoidFunction)dlsym(_glfw.vk.handle,in_RSI);
      }
      local_8 = local_20;
    }
  }
  return local_8;
}

Assistant:

GLFWAPI GLFWvkproc glfwGetInstanceProcAddress(VkInstance instance,
                                              const char* procname)
{
    GLFWvkproc proc;
    assert(procname != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (!_glfwInitVulkan(_GLFW_REQUIRE_LOADER))
        return NULL;

    proc = (GLFWvkproc) vkGetInstanceProcAddr(instance, procname);
#if defined(_GLFW_VULKAN_STATIC)
    if (!proc)
    {
        if (strcmp(procname, "vkGetInstanceProcAddr") == 0)
            return (GLFWvkproc) vkGetInstanceProcAddr;
    }
#else
    if (!proc)
        proc = (GLFWvkproc) _glfw_dlsym(_glfw.vk.handle, procname);
#endif

    return proc;
}